

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_variables.c
# Opt level: O0

ngx_int_t ngx_http_variable_msec(ngx_http_request_t *r,ngx_http_variable_value_t *v,uintptr_t data)

{
  u_char *buf;
  u_char *puVar1;
  ngx_time_t *tp;
  u_char *p;
  uintptr_t data_local;
  ngx_http_variable_value_t *v_local;
  ngx_http_request_t *r_local;
  
  buf = (u_char *)ngx_pnalloc(r->pool,0x18);
  if (buf == (u_char *)0x0) {
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else {
    puVar1 = ngx_sprintf(buf,"%T.%03M",ngx_cached_time->sec,ngx_cached_time->msec);
    *(uint *)v = *(uint *)v & 0xf0000000 | (int)puVar1 - (int)buf & 0xfffffffU;
    *(uint *)v = *(uint *)v & 0xefffffff | 0x10000000;
    *(uint *)v = *(uint *)v & 0xdfffffff;
    *(uint *)v = *(uint *)v & 0xbfffffff;
    v->data = buf;
    r_local = (ngx_http_request_t *)0x0;
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_variable_msec(ngx_http_request_t *r,
    ngx_http_variable_value_t *v, uintptr_t data)
{
    u_char      *p;
    ngx_time_t  *tp;

    p = ngx_pnalloc(r->pool, NGX_TIME_T_LEN + 4);
    if (p == NULL) {
        return NGX_ERROR;
    }

    tp = ngx_timeofday();

    v->len = ngx_sprintf(p, "%T.%03M", tp->sec, tp->msec) - p;
    v->valid = 1;
    v->no_cacheable = 0;
    v->not_found = 0;
    v->data = p;

    return NGX_OK;
}